

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxbmhandler.cpp
# Opt level: O1

ssize_t __thiscall QXbmHandler::write(QXbmHandler *this,int __fd,void *__buf,size_t __n)

{
  undefined1 uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  Format FVar6;
  QRgb QVar7;
  QRgb QVar8;
  QIODevice *pQVar9;
  char *__s;
  uchar *puVar10;
  long lVar11;
  size_t sVar12;
  char16_t *pcVar13;
  int iVar14;
  ulong uVar15;
  undefined1 *puVar16;
  uint i;
  undefined4 in_register_00000034;
  int iVar17;
  int iVar18;
  long lVar19;
  char *pcVar20;
  char *pcVar21;
  int iVar22;
  long in_FS_OFFSET;
  undefined1 auVar23 [16];
  QImage local_b0;
  QString local_98;
  undefined1 local_78 [16];
  QImageData *local_68;
  undefined1 local_58 [10];
  char acStack_4e [6];
  QImageData *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = QImageIOHandler::device(&this->super_QImageIOHandler);
  local_68 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)local_78,(QImage *)CONCAT44(in_register_00000034,__fd));
  uVar4 = QImage::width((QImage *)local_78);
  uVar5 = QImage::height((QImage *)local_78);
  local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toUtf8_helper(&local_98);
  puVar16 = (undefined1 *)(local_98.d.size + 100);
  __s = (char *)operator_new__((ulong)puVar16);
  pcVar13 = local_98.d.ptr;
  if (local_98.d.ptr == (char16_t *)0x0) {
    pcVar13 = (char16_t *)&QByteArray::_empty;
  }
  snprintf(__s,(size_t)puVar16,"#define %s_width %d\n",pcVar13,(ulong)uVar4);
  strlen(__s);
  QIODevice::write((char *)pQVar9,(longlong)__s);
  pcVar13 = local_98.d.ptr;
  if (local_98.d.ptr == (char16_t *)0x0) {
    pcVar13 = (char16_t *)&QByteArray::_empty;
  }
  snprintf(__s,(size_t)puVar16,"#define %s_height %d\n",pcVar13,(ulong)uVar5);
  strlen(__s);
  QIODevice::write((char *)pQVar9,(longlong)__s);
  snprintf(__s,(size_t)puVar16,"static char %s_bits[] = {\n ");
  strlen(__s);
  QIODevice::write((char *)pQVar9,(longlong)__s);
  FVar6 = QImage::format((QImage *)local_78);
  if (FVar6 != Format_MonoLSB) {
    QImage::convertToFormat_helper
              (&local_b0,(QImage *)local_78,Format_MonoLSB,(ImageConversionFlags)0x0);
    local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
    local_48 = local_68;
    local_68 = local_b0.d;
    local_58._0_8_ = &PTR__QImage_007e2f38;
    local_b0.d = (QImageData *)0x0;
    QImage::~QImage((QImage *)local_58);
    QImage::~QImage(&local_b0);
  }
  lVar19 = 0;
  QVar7 = QImage::color((QImage *)local_78,0);
  QVar8 = QImage::color((QImage *)local_78,1);
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
  auVar23 = _DAT_00684840;
  do {
    if (SUB164(auVar23 ^ _DAT_00684850,4) == -0x80000000 &&
        SUB164(auVar23 ^ _DAT_00684850,0) < -0x7ffffff6) {
      local_58[lVar19] = (byte)lVar19 + 0x30;
      local_58[lVar19 + 1] = (byte)lVar19 | 0x31;
    }
    lVar19 = lVar19 + 2;
    lVar11 = auVar23._8_8_;
    auVar23._0_8_ = auVar23._0_8_ + 2;
    auVar23._8_8_ = lVar11 + 2;
  } while (lVar19 != 10);
  uVar15 = 0;
  do {
    if (uVar15 < 6) {
      acStack_4e[uVar15] = (char)uVar15 + 'a';
      acStack_4e[uVar15 + 1] = (char)uVar15 + 'b';
    }
    uVar15 = uVar15 + 2;
  } while (uVar15 != 6);
  if ((QVar7 & 0xff) * 5 + (QVar7 >> 4 & 0xff0) + (QVar7 >> 0x10 & 0xff) * 0xb >> 5 <
      (QVar8 & 0xff) * 5 + (QVar8 >> 4 & 0xff0) + (QVar8 >> 0x10 & 0xff) * 0xb >> 5) {
    lVar19 = 0xf;
    puVar16 = local_58;
    do {
      uVar1 = local_58[lVar19];
      local_58[lVar19] = *puVar16;
      *puVar16 = uVar1;
      lVar19 = lVar19 + -1;
      puVar16 = puVar16 + 1;
    } while (lVar19 != 7);
  }
  iVar14 = uVar4 + 0xe;
  if (-1 < (int)(uVar4 + 7)) {
    iVar14 = uVar4 + 7;
  }
  bVar3 = 0 < (int)uVar5;
  pcVar21 = __s;
  if (0 < (int)uVar5) {
    iVar14 = iVar14 >> 3;
    iVar17 = 1;
    if (1 < iVar14) {
      iVar17 = iVar14;
    }
    i = 0;
    bVar3 = true;
    iVar22 = 0;
    do {
      puVar10 = QImage::constScanLine((QImage *)local_78,i);
      bVar2 = 0 < (int)uVar4;
      if (0 < (int)uVar4) {
        bVar2 = true;
        lVar19 = 0;
        pcVar20 = pcVar21;
        iVar18 = iVar22;
        do {
          pcVar20[0] = '0';
          pcVar20[1] = 'x';
          pcVar20[2] = local_58[puVar10[lVar19] >> 4];
          pcVar20[3] = local_58[puVar10[lVar19] & 0xf];
          if ((int)lVar19 < iVar14 + -1 || (int)i < (int)(uVar5 - 1)) {
            pcVar20[4] = ',';
            iVar22 = iVar18 + 1;
            if (iVar18 < 0xe) {
              pcVar21 = pcVar20 + 5;
              iVar18 = iVar22;
            }
            else {
              pcVar20[5] = '\n';
              pcVar20[6] = ' ';
              pcVar20[7] = '\0';
              sVar12 = strlen(__s);
              lVar11 = QIODevice::write((char *)pQVar9,(longlong)__s);
              pcVar21 = __s;
              iVar18 = 0;
              if ((int)sVar12 != lVar11) {
                pcVar21 = pcVar20 + 7;
                operator_delete__(__s);
                break;
              }
            }
          }
          else {
            pcVar21 = pcVar20 + 4;
          }
          iVar22 = iVar18;
          lVar19 = lVar19 + 1;
          bVar2 = (int)lVar19 < iVar14;
          pcVar20 = pcVar21;
          iVar18 = iVar22;
        } while (iVar17 != (int)lVar19);
      }
      if (bVar2) break;
      i = i + 1;
      bVar3 = (int)i < (int)uVar5;
    } while (i != uVar5);
  }
  if (bVar3) {
    uVar15 = 0;
  }
  else {
    builtin_strncpy(pcVar21," };\n",5);
    sVar12 = strlen(__s);
    lVar19 = QIODevice::write((char *)pQVar9,(longlong)__s);
    uVar15 = CONCAT71((int7)(int3)(sVar12 >> 8),(int)sVar12 == lVar19);
    operator_delete__(__s);
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
    }
  }
  QImage::~QImage((QImage *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar15 & 0xffffffff;
}

Assistant:

bool QXbmHandler::write(const QImage &image)
{
    return write_xbm_image(image, device(), fileName);
}